

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_lexer.yy.cc
# Opt level: O1

void __thiscall yyFlexLexer::yyunput(yyFlexLexer *this,int c,char *yy_bp)

{
  yy_buffer_state *pyVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  
  pcVar6 = this->yy_c_buf_p;
  *pcVar6 = this->yy_hold_char;
  pcVar5 = this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf;
  if (pcVar6 < pcVar5 + 2) {
    pcVar4 = pcVar5 + (long)this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_buf_size + 2;
    pcVar5 = pcVar5 + (long)this->yy_n_chars + 2;
    while( true ) {
      pyVar1 = this->yy_buffer_stack[this->yy_buffer_stack_top];
      pcVar2 = pyVar1->yy_ch_buf;
      if (pcVar5 <= pcVar2) break;
      pcVar2 = pcVar5 + -1;
      pcVar5 = pcVar5 + -1;
      pcVar4[-1] = *pcVar2;
      pcVar4 = pcVar4 + -1;
    }
    iVar3 = (int)pcVar4 - (int)pcVar5;
    pcVar6 = pcVar6 + iVar3;
    yy_bp = yy_bp + iVar3;
    iVar3 = pyVar1->yy_buf_size;
    this->yy_n_chars = iVar3;
    pyVar1->yy_n_chars = iVar3;
    if (pcVar6 < pcVar2 + 2) {
      (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])(this,"flex scanner push-back overflow");
    }
  }
  pcVar6[-1] = (char)c;
  (this->super_FlexLexer).yytext = yy_bp;
  this->yy_hold_char = pcVar6[-1];
  this->yy_c_buf_p = pcVar6 + -1;
  return;
}

Assistant:

void yyFlexLexer::yyunput( int c, char* yy_bp)
/* %endif */
{
	char *yy_cp;
    
    yy_cp = (yy_c_buf_p);

	/* undo effects of setting up yytext */
	*yy_cp = (yy_hold_char);

	if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
		{ /* need to shift things up to make room */
		/* +2 for EOB chars. */
		int number_to_move = (yy_n_chars) + 2;
		char *dest = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[
					YY_CURRENT_BUFFER_LVALUE->yy_buf_size + 2];
		char *source =
				&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move];

		while ( source > YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			*--dest = *--source;

		yy_cp += (int) (dest - source);
		yy_bp += (int) (dest - source);
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars =
			(yy_n_chars) = (int) YY_CURRENT_BUFFER_LVALUE->yy_buf_size;

		if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
			YY_FATAL_ERROR( "flex scanner push-back overflow" );
		}

	*--yy_cp = (char) c;

/* %% [18.0] update yylineno here */

	(yytext_ptr) = yy_bp;
	(yy_hold_char) = *yy_cp;
	(yy_c_buf_p) = yy_cp;
}